

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O3

void * Res_SatProveUnsat(Abc_Ntk_t *pAig,Vec_Ptr_t *vFanins)

{
  int iVar0;
  long *plVar1;
  long lVar2;
  bool bVar3;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  sat_solver *s;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  lit Lit;
  lit Lit_1;
  lit Lit_2;
  int local_34;
  int local_30;
  int local_2c;
  
  if (0 < vFanins->nSize) {
    pAVar4 = (Abc_Obj_t *)*vFanins->pArray;
    if ((pAVar4->pNtk != pAig) || ((*(uint *)&pAVar4->field_0x14 & 0xf) != 3)) {
      __assert_fail("pObj->pNtk == pAig && Abc_ObjIsPo(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                    ,0x3e,"void *Res_SatProveUnsat(Abc_Ntk_t *, Vec_Ptr_t *)");
    }
    __ptr = Abc_NtkDfsNodes(pAig,(Abc_Obj_t **)vFanins->pArray,vFanins->nSize);
    pAVar4 = Abc_AigConst1(pAig);
    (pAVar4->field_6).pTemp = (void *)0x0;
    pVVar5 = pAig->vPis;
    if (pVVar5->nSize < 1) {
      uVar10 = 1;
    }
    else {
      uVar9 = 1;
      do {
        *(ulong *)((long)pVVar5->pArray[uVar9 - 1] + 0x40) = uVar9;
        uVar10 = uVar9 + 1;
        pVVar5 = pAig->vPis;
        bVar3 = (long)uVar9 < (long)pVVar5->nSize;
        uVar9 = uVar10;
      } while (bVar3);
    }
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        *(ulong *)((long)__ptr->pArray[lVar6] + 0x40) = lVar6 + (uVar10 & 0xffffffff);
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
      uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar6);
    }
    iVar8 = (int)uVar10;
    if (0 < vFanins->nSize) {
      lVar6 = 0;
      do {
        *(ulong *)((long)vFanins->pArray[lVar6] + 0x40) = lVar6 + (uVar10 & 0xffffffff);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vFanins->nSize);
      iVar8 = iVar8 + (int)lVar6;
    }
    s = sat_solver_new();
    sat_solver_store_alloc(s);
    pAVar4 = Abc_AigConst1(pAig);
    local_34 = (pAVar4->field_6).iTemp * 2;
    sat_solver_addclause(s,&local_34,&local_30);
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        plVar1 = (long *)__ptr->pArray[lVar6];
        lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
        Res_SatAddAnd(s,(int)plVar1[8],
                      *(int *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40),
                      *(int *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40),
                      *(uint *)((long)plVar1 + 0x14) >> 10 & 1,
                      *(uint *)((long)plVar1 + 0x14) >> 0xb & 1);
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (0 < vFanins->nSize) {
      lVar6 = 0;
      do {
        plVar1 = (long *)vFanins->pArray[lVar6];
        Res_SatAddEqual(s,(int)plVar1[8],
                        *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                          (long)*(int *)plVar1[4] * 8) + 0x40),
                        *(uint *)((long)plVar1 + 0x14) >> 10 & 1);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vFanins->nSize);
      if (0 < vFanins->nSize) {
        local_30 = *(int *)((long)*vFanins->pArray + 0x40) * 2;
        sat_solver_addclause(s,&local_30,&local_2c);
        if (1 < vFanins->nSize) {
          local_2c = *(int *)((long)vFanins->pArray[1] + 0x40) * 2;
          sat_solver_addclause(s,&local_2c,(lit *)&stack0xffffffffffffffd8);
          sat_solver_store_mark_clauses_a(s);
          if (1 < vFanins->nSize) {
            Sat_SolverDoubleClauses(s,*(int *)((long)vFanins->pArray[1] + 0x40));
            if (2 < vFanins->nSize) {
              lVar6 = 2;
              do {
                iVar0 = *(int *)((long)vFanins->pArray[lVar6] + 0x40);
                Res_SatAddEqual(s,iVar0,iVar0 + iVar8,0);
                lVar6 = lVar6 + 1;
              } while (lVar6 < vFanins->nSize);
            }
            sat_solver_store_mark_roots(s);
            pvVar7 = (void *)0x0;
            iVar8 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
            if (iVar8 == -1) {
              pvVar7 = sat_solver_store_release(s);
            }
            sat_solver_delete(s);
            return pvVar7;
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void * Res_SatProveUnsat( Abc_Ntk_t * pAig, Vec_Ptr_t * vFanins )
{
    void * pCnf = NULL;
    sat_solver * pSat;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes, status;

    // make sure fanins contain POs of the AIG
    pObj = (Abc_Obj_t *)Vec_PtrEntry( vFanins, 0 );
    assert( pObj->pNtk == pAig && Abc_ObjIsPo(pObj) );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat );

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add trivial clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 0);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // on-set

    // bookmark the clauses of A
    sat_solver_store_mark_clauses_a( pSat );

    // duplicate the clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Sat_SolverDoubleClauses( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy );
    // add the equality constraints
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vFanins, pObj, i, 2 )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, ((int)(ABC_PTRUINT_T)pObj->pCopy) + nNodes, 0 );

    // bookmark the roots
    sat_solver_store_mark_roots( pSat );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        pCnf = sat_solver_store_release( pSat );
//        printf( "unsat\n" );
    }
    else if ( status == l_True )
    {
//        printf( "sat\n" );
    }
    else
    {
//        printf( "undef\n" );
    }
    sat_solver_delete( pSat );
    return pCnf;
}